

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O0

bool __thiscall ON_PolylineCurve::SetEndPoint(ON_PolylineCurve *this,ON_3dPoint end_point)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  ON_3dPoint *pOVar4;
  bool local_31;
  int count;
  bool rc;
  ON_PolylineCurve *this_local;
  
  bVar2 = ON_Curve::SetEndPoint(&this->super_ON_Curve,end_point);
  if (bVar2) {
    return true;
  }
  local_31 = false;
  iVar3 = ON_SimpleArray<ON_3dPoint>::Count((ON_SimpleArray<ON_3dPoint> *)&this->m_pline);
  if (1 < iVar3) {
    pOVar4 = ON_SimpleArray<ON_3dPoint>::operator[]
                       ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,iVar3 + -1);
    bVar2 = ON_3dPoint::IsValid(pOVar4);
    if (bVar2) {
      pOVar4 = ON_SimpleArray<ON_3dPoint>::operator[]
                         ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,iVar3 + -1);
      dVar1 = pOVar4->x;
      pOVar4 = ON_SimpleArray<ON_3dPoint>::operator[]
                         ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,0);
      if ((dVar1 == pOVar4->x) && (!NAN(dVar1) && !NAN(pOVar4->x))) {
        pOVar4 = ON_SimpleArray<ON_3dPoint>::operator[]
                           ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,iVar3 + -1);
        dVar1 = pOVar4->y;
        pOVar4 = ON_SimpleArray<ON_3dPoint>::operator[]
                           ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,0);
        if ((dVar1 == pOVar4->y) && (!NAN(dVar1) && !NAN(pOVar4->y))) {
          pOVar4 = ON_SimpleArray<ON_3dPoint>::operator[]
                             ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,iVar3 + -1);
          dVar1 = pOVar4->z;
          pOVar4 = ON_SimpleArray<ON_3dPoint>::operator[]
                             ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,0);
          if ((dVar1 == pOVar4->z) && (!NAN(dVar1) && !NAN(pOVar4->z))) goto LAB_0080bd05;
        }
      }
    }
    pOVar4 = ON_SimpleArray<ON_3dPoint>::operator[]
                       ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,iVar3 + -1);
    pOVar4->x = end_point.x;
    pOVar4->y = end_point.y;
    pOVar4->z = end_point.z;
    local_31 = true;
  }
LAB_0080bd05:
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return local_31;
}

Assistant:

bool ON_PolylineCurve::SetEndPoint(
        ON_3dPoint end_point
        )
{
  // 10 March 2009 Dale Lear
  //    I'm using exact compare instead of the fuzzy IsClosed()
  //    check to permit setting the start point.  This fixes
  //    a bug Mikko reported that prevented making polylines
  //    exactly closed when the end points were almost exactly
  //    equal.  At this point, I don't remember why we don't allow
  //    SetEndPoint() the end point of a closed curve.
  if (ON_Curve::SetEndPoint(end_point))
    return true;
  bool rc = false;
  int count = m_pline.Count();
  if (    count >= 2 
    && ( !m_pline[count-1].IsValid()
         || m_pline[count-1].x != m_pline[0].x // used to call IsClosed()
         || m_pline[count-1].y != m_pline[0].y
         || m_pline[count-1].z != m_pline[0].z
       )
     )
  {
    m_pline[count-1] = end_point;
    rc = true;
  }
	DestroyCurveTree();
  return rc;
}